

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# luckySwap.c
# Opt level: O0

void Kit_TruthSwapAdjacentVars_64bit(word *pInOut,int nVars,int iVar)

{
  word wVar1;
  int iVar2;
  int iVar3;
  byte bVar4;
  undefined1 auStack_828 [4];
  int nWords;
  word temp [256];
  int SizeOfBlock;
  int Shift;
  int Step;
  int i;
  int iVar_local;
  int nVars_local;
  word *pInOut_local;
  
  iVar2 = Kit_TruthWordNum_64bit(nVars);
  if (nVars + -1 <= iVar) {
    __assert_fail("iVar < nVars - 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/bool/lucky/luckySwap.c"
                  ,0x9a,"void Kit_TruthSwapAdjacentVars_64bit(word *, int, int)");
  }
  if (iVar < 5) {
    for (Shift = 0; Shift < iVar2; Shift = Shift + 1) {
      bVar4 = (byte)(1 << ((byte)iVar & 0x1f));
      pInOut[Shift] =
           pInOut[Shift] & Kit_TruthSwapAdjacentVars_64bit::PMasks[iVar][0] |
           (pInOut[Shift] & Kit_TruthSwapAdjacentVars_64bit::PMasks[iVar][1]) << (bVar4 & 0x3f) |
           (pInOut[Shift] & Kit_TruthSwapAdjacentVars_64bit::PMasks[iVar][2]) >> (bVar4 & 0x3f);
    }
  }
  else if (iVar < 6) {
    for (Shift = 0; Shift < iVar2; Shift = Shift + 2) {
      wVar1 = pInOut[Shift + 1];
      pInOut[Shift + 1] = (wVar1 << 0x20 ^ pInOut[Shift]) >> 0x20 ^ pInOut[Shift + 1];
      pInOut[Shift] = pInOut[Shift] & 0xffffffff | wVar1 << 0x20;
    }
  }
  else {
    iVar3 = 1 << ((byte)iVar - 6 & 0x1f);
    temp[0xff]._0_4_ = iVar3 << 3;
    _iVar_local = pInOut + (iVar3 << 1);
    for (Shift = iVar3 << 1; Shift < iVar2; Shift = iVar3 * 4 + Shift) {
      memcpy(auStack_828,_iVar_local + -(long)iVar3,(long)(int)temp[0xff]);
      memcpy(_iVar_local + -(long)iVar3,_iVar_local,(long)(int)temp[0xff]);
      memcpy(_iVar_local,auStack_828,(long)(int)temp[0xff]);
      _iVar_local = _iVar_local + (iVar3 << 2);
    }
  }
  return;
}

Assistant:

void Kit_TruthSwapAdjacentVars_64bit( word * pInOut, int nVars, int iVar )
{
    int i, Step, Shift, SizeOfBlock;                   //
    word temp[256];                   // to make only pInOut possible
    static word PMasks[5][3] = {
        { ABC_CONST(0x9999999999999999), ABC_CONST(0x2222222222222222), ABC_CONST(0x4444444444444444) },
        { ABC_CONST(0xC3C3C3C3C3C3C3C3), ABC_CONST(0x0C0C0C0C0C0C0C0C), ABC_CONST(0x3030303030303030) },
        { ABC_CONST(0xF00FF00FF00FF00F), ABC_CONST(0x00F000F000F000F0), ABC_CONST(0x0F000F000F000F00) },
        { ABC_CONST(0xFF0000FFFF0000FF), ABC_CONST(0x0000FF000000FF00), ABC_CONST(0x00FF000000FF0000) },
        { ABC_CONST(0xFFFF00000000FFFF), ABC_CONST(0x00000000FFFF0000), ABC_CONST(0x0000FFFF00000000) }
    };
    int nWords = Kit_TruthWordNum_64bit( nVars ); 
    
    assert( iVar < nVars - 1 );
    if ( iVar < 5 )
    {
        Shift = (1 << iVar);
        for ( i = 0; i < nWords; i++ )
            pInOut[i] = (pInOut[i] & PMasks[iVar][0]) | ((pInOut[i] & PMasks[iVar][1]) << Shift) | ((pInOut[i] & PMasks[iVar][2]) >> Shift);
    }
    else if ( iVar > 5 )
    {
        Step = 1 << (iVar - 6);
        SizeOfBlock = sizeof(word)*Step;
        pInOut += 2*Step;
        for(i=2*Step; i<nWords; i+=4*Step)
        {           
            memcpy(temp,pInOut-Step,SizeOfBlock);
            memcpy(pInOut-Step,pInOut,SizeOfBlock);
            memcpy(pInOut,temp,SizeOfBlock);
            pInOut += 4*Step;
        }
    }
    else // if ( iVar == 5 )
    {
        for ( i = 0; i < nWords; i += 2 )
        {
            temp[0] = pInOut[i+1] << 32;
            pInOut[i+1] ^= (temp[0] ^ pInOut[i]) >> 32;
            pInOut[i] = (pInOut[i] & 0x00000000FFFFFFFF) | temp[0];
            
        }
    }
}